

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::updateNormalGeometry(QWidgetWindow *this)

{
  QRect *pQVar1;
  WindowStates WVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(*(long *)((this->m_widget).wp.value + 8) + 0x78);
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)(lVar4 + 8);
  }
  if (lVar4 != 0) {
    plVar3 = (long *)QWindow::handle();
    if (plVar3 == (long *)0x0) {
      QVar6 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      uVar5 = 0;
    }
    else {
      local_40 = (QRect)(**(code **)(*plVar3 + 0x38))(plVar3);
      QVar6 = QHighDpi::fromNativePixels<QRect,QWidgetWindow>(&local_40,this);
      uVar5 = QVar6._0_8_ >> 0x20;
    }
    if (QVar6.x2.m_i.m_i < QVar6.x1.m_i.m_i || QVar6.y2.m_i.m_i < (int)uVar5) {
      WVar2 = QWidget::windowState((QWidget *)(this->m_widget).wp.value);
      if (((uint)WVar2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7) == 0) {
        pQVar1 = (QRect *)(*(long *)((this->m_widget).wp.value + 0x20) + 0x14);
        uVar5._0_4_ = pQVar1->x1;
        uVar5._4_4_ = pQVar1->y1;
        QVar6 = *pQVar1;
        uVar5 = uVar5 >> 0x20;
      }
    }
    if ((QVar6.x1.m_i.m_i <= QVar6.x2.m_i.m_i) && ((int)uVar5 <= QVar6.y2.m_i.m_i)) {
      *(ulong *)(lVar4 + 0xa0) = QVar6._0_8_ & 0xffffffff | uVar5 << 0x20;
      *(long *)(lVar4 + 0xa8) = QVar6._8_8_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::updateNormalGeometry()
{
    QTLWExtra *tle = m_widget->d_func()->maybeTopData();
    if (!tle)
        return;
     // Ask platform window, default to widget geometry.
    QRect normalGeometry;
    if (const QPlatformWindow *pw = handle())
        normalGeometry = QHighDpi::fromNativePixels(pw->normalGeometry(), this);
    if (!normalGeometry.isValid() && !(m_widget->windowState() & ~Qt::WindowActive))
        normalGeometry = m_widget->geometry();
    if (normalGeometry.isValid())
        tle->normalGeometry = normalGeometry;
}